

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

GLenum gl4cts::TextureViewUtilities::getGLFormatOfInternalformat(GLenum internalformat)

{
  TestError *this;
  GLenum local_10;
  GLenum result;
  GLenum internalformat_local;
  
  if (internalformat == 0x8051) {
    return 0x1907;
  }
  if (internalformat == 0x8054) {
    return 0x1907;
  }
  if (internalformat - 0x8056 < 4) {
    return 0x1908;
  }
  if (internalformat == 0x805b) {
    return 0x1908;
  }
  if (internalformat - 0x81a5 < 2) {
    return 0x1902;
  }
  if (internalformat - 0x8229 < 2) {
LAB_011396cd:
    local_10 = 0x1903;
  }
  else {
    if (1 < internalformat - 0x822b) {
      if (internalformat - 0x822d < 2) goto LAB_011396cd;
      if (1 < internalformat - 0x822f) {
        if (internalformat - 0x8231 < 6) {
          return 0x8d94;
        }
        if (internalformat - 0x8237 < 6) {
          return 0x8228;
        }
        if (internalformat == 0x8814) {
          return 0x1908;
        }
        if (internalformat == 0x8815) {
          return 0x1907;
        }
        if (internalformat == 0x881a) {
          return 0x1908;
        }
        if (internalformat == 0x881b) {
          return 0x1907;
        }
        if (internalformat == 0x88f0) {
          return 0x84f9;
        }
        if (internalformat == 0x8c3a) {
          return 0x1907;
        }
        if (internalformat == 0x8c3d) {
          return 0x1907;
        }
        if (internalformat == 0x8c41) {
          return 0x1907;
        }
        if (internalformat == 0x8c43) {
          return 0x1908;
        }
        if (internalformat == 0x8cac) {
          return 0x1902;
        }
        if (internalformat == 0x8cad) {
          return 0x84f9;
        }
        if (internalformat == 0x8d62) {
          return 0x1907;
        }
        if (internalformat == 0x8d70) {
          return 0x8d99;
        }
        if (internalformat == 0x8d71) {
          return 0x8d98;
        }
        if (internalformat == 0x8d76) {
          return 0x8d99;
        }
        if (internalformat == 0x8d77) {
          return 0x8d98;
        }
        if (internalformat == 0x8d7c) {
          return 0x8d99;
        }
        if (internalformat == 0x8d7d) {
          return 0x8d98;
        }
        if (internalformat == 0x8d82) {
          return 0x8d99;
        }
        if (internalformat == 0x8d83) {
          return 0x8d98;
        }
        if (internalformat == 0x8d88) {
          return 0x8d99;
        }
        if (internalformat == 0x8d89) {
          return 0x8d98;
        }
        if (internalformat == 0x8d8e) {
          return 0x8d99;
        }
        if (internalformat == 0x8d8f) {
          return 0x8d98;
        }
        if (internalformat - 0x8dbb < 2) {
          return 0x8225;
        }
        if (internalformat - 0x8dbd < 2) {
          return 0x8226;
        }
        if (internalformat - 0x8e8c < 2) {
          return 0x84ee;
        }
        if (internalformat - 0x8e8e < 2) {
          return 0x84ed;
        }
        if (internalformat == 0x8f94) goto LAB_011396cd;
        if (internalformat != 0x8f95) {
          if (internalformat == 0x8f96) {
            return 0x1907;
          }
          if (internalformat == 0x8f97) {
            return 0x1908;
          }
          if (internalformat == 0x8f98) goto LAB_011396cd;
          if (internalformat != 0x8f99) {
            if (internalformat == 0x8f9a) {
              return 0x1907;
            }
            if (internalformat == 0x8f9b) {
              return 0x1908;
            }
            if (internalformat == 0x906f) {
              return 0x8d99;
            }
            if (1 < internalformat - 0x9270) {
              if (internalformat - 0x9272 < 2) {
                return 0x8226;
              }
              if (internalformat - 0x9274 < 2) {
                return 0x84ed;
              }
              if (internalformat - 0x9276 < 4) {
                return 0x84ee;
              }
              this = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this,"Unrecognized internalformat",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                         ,0x41f);
              __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
            }
            return 0x8225;
          }
        }
      }
    }
    local_10 = 0x8227;
  }
  return local_10;
}

Assistant:

glw::GLenum TextureViewUtilities::getGLFormatOfInternalformat(const glw::GLenum internalformat)
{
	glw::GLenum result = FORMAT_UNDEFINED;

	switch (internalformat)
	{
	case GL_COMPRESSED_RGBA_BPTC_UNORM:
	case GL_COMPRESSED_RGB8_PUNCHTHROUGH_ALPHA1_ETC2:
	case GL_COMPRESSED_RGBA8_ETC2_EAC:
	case GL_COMPRESSED_SRGB_ALPHA_BPTC_UNORM:
	case GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC:
	case GL_COMPRESSED_SRGB8_PUNCHTHROUGH_ALPHA1_ETC2:
	{
		result = GL_COMPRESSED_RGBA;

		break;
	}

	case GL_RGB10_A2:
	case GL_RGB5_A1:
	case GL_RGBA16:
	case GL_RGBA16F:
	case GL_RGBA16_SNORM:
	case GL_RGBA32F:
	case GL_RGBA4:
	case GL_RGBA8:
	case GL_RGBA8_SNORM:
	case GL_SRGB8_ALPHA8:
	{
		result = GL_RGBA;

		break;
	}

	case GL_RGB10_A2UI:
	case GL_RGBA16I:
	case GL_RGBA16UI:
	case GL_RGBA32I:
	case GL_RGBA32UI:
	case GL_RGBA8I:
	case GL_RGBA8UI:
	{
		result = GL_RGBA_INTEGER;

		break;
	}

	case GL_COMPRESSED_RGB8_ETC2:
	case GL_COMPRESSED_RGB_BPTC_SIGNED_FLOAT:
	case GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT:
	case GL_COMPRESSED_SRGB8_ETC2:
	{
		result = GL_COMPRESSED_RGB;

		break;
	}

	case GL_R11F_G11F_B10F:
	case GL_RGB16:
	case GL_RGB16_SNORM:
	case GL_RGB16F:
	case GL_RGB32F:
	case GL_RGB565:
	case GL_RGB8:
	case GL_RGB8_SNORM:
	case GL_RGB9_E5:
	case GL_SRGB8:
	{
		result = GL_RGB;

		break;
	}

	case GL_RGB16I:
	case GL_RGB16UI:
	case GL_RGB32I:
	case GL_RGB32UI:
	case GL_RGB8I:
	case GL_RGB8UI:
	{
		result = GL_RGB_INTEGER;

		break;
	}

	case GL_COMPRESSED_RG_RGTC2:
	case GL_COMPRESSED_RG11_EAC:
	case GL_COMPRESSED_SIGNED_RG_RGTC2:
	case GL_COMPRESSED_SIGNED_RG11_EAC:
	{
		result = GL_COMPRESSED_RG;

		break;
	}

	case GL_RG16:
	case GL_RG16_SNORM:
	case GL_RG16F:
	case GL_RG32F:
	case GL_RG8:
	case GL_RG8_SNORM:
	{
		result = GL_RG;

		break;
	}

	case GL_RG16I:
	case GL_RG16UI:
	case GL_RG32I:
	case GL_RG32UI:
	case GL_RG8I:
	case GL_RG8UI:
	{
		result = GL_RG_INTEGER;

		break;
	}

	case GL_COMPRESSED_R11_EAC:
	case GL_COMPRESSED_RED_RGTC1:
	case GL_COMPRESSED_SIGNED_R11_EAC:
	case GL_COMPRESSED_SIGNED_RED_RGTC1:
	{
		result = GL_COMPRESSED_RED;

		break;
	}

	case GL_R16:
	case GL_R16F:
	case GL_R16_SNORM:
	case GL_R32F:
	case GL_R8:
	case GL_R8_SNORM:
	{
		result = GL_RED;

		break;
	}

	case GL_R16I:
	case GL_R16UI:
	case GL_R32I:
	case GL_R32UI:
	case GL_R8I:
	case GL_R8UI:
	{
		result = GL_RED_INTEGER;

		break;
	}

	case GL_DEPTH_COMPONENT16:
	case GL_DEPTH_COMPONENT24:
	case GL_DEPTH_COMPONENT32F:
	{
		result = GL_DEPTH_COMPONENT;

		break;
	}

	case GL_DEPTH24_STENCIL8:
	case GL_DEPTH32F_STENCIL8:
	{
		result = GL_DEPTH_STENCIL;

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized internalformat");
	}
	} /* switch (internalformat) */

	return result;
}